

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_movrr(ASMState *as,IRIns *ir,Reg dst,Reg src)

{
  int iVar1;
  Reg src_local;
  Reg dst_local;
  IRIns *ir_local;
  ASMState *as_local;
  
  if (dst < 0x10) {
    iVar1 = 0;
    if ((0x605fd9U >> ((ir->field_1).t.irt & 0x1f) & 1) != 0) {
      iVar1 = 0x80200;
    }
    emit_rr(as,XO_MOV,dst + iVar1,src);
  }
  else {
    emit_rr(as,XO_MOVAPS,dst,src);
  }
  return;
}

Assistant:

static void emit_movrr(ASMState *as, IRIns *ir, Reg dst, Reg src)
{
  UNUSED(ir);
  if (dst < RID_MAX_GPR)
    emit_rr(as, XO_MOV, REX_64IR(ir, dst), src);
  else
    emit_rr(as, XO_MOVAPS, dst, src);
}